

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O3

void print_elapsed_time_proc(Am_Object *interp)

{
  int iVar1;
  Am_Value *pAVar2;
  long lVar3;
  ostream *poVar4;
  Am_Time stop;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  Am_Object::Get_Prototype();
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&AStack_38,0xca);
  Am_Object_Method::Am_Object_Method(&local_28,pAVar2);
  Am_Object::Am_Object(&local_30,interp);
  (*local_28.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&AStack_38);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)interp,0x169);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Time::Now();
  Am_Time::operator-((Am_Time *)&AStack_38,(Am_Time *)&local_28);
  lVar3 = Am_Time::Milliseconds();
  Am_Time::~Am_Time((Am_Time *)&AStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Animation constraint executed ",0x1e);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," steps in ",10);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"for average cost of ",0x14);
  poVar4 = std::ostream::_M_insert<double>((double)lVar3 / (double)iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms per iteration.",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ostream::flush();
  Am_Exit_Main_Event_Loop();
  Am_Time::~Am_Time((Am_Time *)&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, print_elapsed_time, (Am_Object interp))
{
  Am_Object_Method(interp.Get_Prototype().Get(Am_DO_METHOD)).Call(interp);

  int n = interp.Get(Am_VALUE);
  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Animation constraint executed " << n << " steps in " << ms
            << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  Am_Exit_Main_Event_Loop();
}